

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

time_t isodate7(uchar *v)

{
  uchar uVar1;
  time_t tVar2;
  tm local_38;
  
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  local_38.tm_year = (int)*v;
  local_38.tm_mon = v[1] - 1;
  local_38.tm_mday = (int)v[2];
  local_38.tm_hour = (int)v[3];
  local_38.tm_min = (int)v[4];
  local_38.tm_sec = (int)v[5];
  uVar1 = v[6];
  if ((byte)(uVar1 + 0x2f) < 99) {
    local_38.tm_hour =
         (char)-((char)(((byte)((char)uVar1 >> 7) >> 6) + uVar1) >> 2) + local_38.tm_hour;
    local_38.tm_min = (char)(((char)uVar1 % '\x04') * -0xf) + local_38.tm_min;
  }
  tVar2 = timegm(&local_38);
  if (tVar2 == -1) {
    tVar2 = 0;
  }
  return tVar2;
}

Assistant:

static time_t
isodate7(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = v[0];
	tm.tm_mon = v[1] - 1;
	tm.tm_mday = v[2];
	tm.tm_hour = v[3];
	tm.tm_min = v[4];
	tm.tm_sec = v[5];
	/* v[6] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[6];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}